

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_3_4::RgbaInputFile::FromYca::readPixels(FromYca *this,int scanLine)

{
  Rgba RVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  ArgExc *this_00;
  int *piVar5;
  int in_ESI;
  Rgba *in_RDI;
  Rgba *ptr;
  int i_4;
  intptr_t base;
  int i_3;
  int n_3;
  int i_2;
  int yMax;
  int n_2;
  int i_1;
  int n_1;
  int i;
  int yMin;
  int n;
  int dy;
  stringstream _iex_throw_s;
  Rgba *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  FromYca *in_stack_fffffffffffffdf0;
  FromYca *in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe0c;
  int iVar6;
  V3f *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  int local_1c8;
  int local_1c4;
  undefined4 in_stack_fffffffffffffe40;
  int iVar7;
  undefined4 in_stack_fffffffffffffe44;
  int iVar8;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  int iVar9;
  int local_1b0;
  int in_stack_fffffffffffffe54;
  int local_1a8 [4];
  stringstream local_198 [16];
  ostream local_188 [84];
  int in_stack_fffffffffffffecc;
  FromYca *in_stack_fffffffffffffed0;
  
  if (in_RDI[0x2e] != (Rgba)0x0) {
    local_1a8[0] = in_ESI - *(int *)(in_RDI + 9);
    iVar6 = local_1a8[0];
    if (local_1a8[0] < 1) {
      iVar6 = -local_1a8[0];
    }
    if (iVar6 < 0x1d) {
      rotateBuf1(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    }
    iVar6 = local_1a8[0];
    if (local_1a8[0] < 1) {
      iVar6 = -local_1a8[0];
    }
    if (iVar6 < 3) {
      rotateBuf2(in_stack_fffffffffffffe00,(int)((ulong)in_RDI >> 0x20));
    }
    if (local_1a8[0] < 0) {
      local_1b0 = -local_1a8[0];
      iVar9 = 0x1d;
      piVar5 = std::min<int>(&local_1b0,(int *)&stack0xfffffffffffffe4c);
      iVar6 = *piVar5;
      iVar2 = in_ESI + -0xe;
      iVar8 = iVar6;
      while (iVar8 = iVar8 + -1, -1 < iVar8) {
        readYCAScanLine(in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                        in_stack_fffffffffffffde0);
      }
      local_1c4 = -local_1a8[0];
      local_1c8 = 3;
      piVar5 = std::min<int>(&local_1c4,&local_1c8);
      iVar7 = *piVar5;
      for (in_stack_fffffffffffffe34 = 0; in_stack_fffffffffffffe34 < iVar7;
          in_stack_fffffffffffffe34 = in_stack_fffffffffffffe34 + 1) {
        if ((in_ESI + in_stack_fffffffffffffe34 & 1U) == 0) {
          RgbaYca::reconstructChromaVert
                    (iVar6,(Rgba **)CONCAT44(iVar9,iVar2),(Rgba *)CONCAT44(iVar8,iVar7));
          RgbaYca::YCAtoRGBA(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                             (Rgba *)in_stack_fffffffffffffe00,in_RDI);
        }
        else {
          RgbaYca::YCAtoRGBA(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                             (Rgba *)in_stack_fffffffffffffe00,in_RDI);
        }
      }
    }
    else {
      in_stack_fffffffffffffe2c = 0x1d;
      piVar5 = std::min<int>(local_1a8,(int *)&stack0xfffffffffffffe2c);
      in_stack_fffffffffffffe30 = *piVar5;
      in_stack_fffffffffffffe24 = in_stack_fffffffffffffe30;
      while (in_stack_fffffffffffffe24 = in_stack_fffffffffffffe24 + -1,
            -1 < in_stack_fffffffffffffe24) {
        readYCAScanLine(in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                        in_stack_fffffffffffffde0);
      }
      in_stack_fffffffffffffe1c = 3;
      piVar5 = std::min<int>(local_1a8,(int *)&stack0xfffffffffffffe1c);
      in_stack_fffffffffffffe20 = *piVar5;
      for (in_stack_fffffffffffffe18 = 2; 2 - in_stack_fffffffffffffe20 < in_stack_fffffffffffffe18;
          in_stack_fffffffffffffe18 = in_stack_fffffffffffffe18 + -1) {
        if ((in_ESI + in_stack_fffffffffffffe18 & 1U) == 0) {
          RgbaYca::reconstructChromaVert
                    (in_stack_fffffffffffffe54,
                     (Rgba **)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                     (Rgba *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
          RgbaYca::YCAtoRGBA(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                             (Rgba *)in_stack_fffffffffffffe00,in_RDI);
        }
        else {
          RgbaYca::YCAtoRGBA(in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
                             (Rgba *)in_stack_fffffffffffffe00,in_RDI);
        }
      }
    }
    RgbaYca::fixSaturation
              ((V3f *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe2c,
               (Rgba **)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               (Rgba *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    RVar1 = in_RDI[0x2e];
    for (iVar6 = 0; iVar8._0_2_ = in_RDI[8].r, iVar8._2_2_ = in_RDI[8].g, iVar6 < iVar8;
        iVar6 = iVar6 + 1) {
      *(undefined8 *)
       ((long)RVar1 +
       ((long)in_RDI[0x30] * (long)in_ESI +
       (long)in_RDI[0x2f] * (long)(iVar6 + *(int *)&in_RDI[6].b)) * 8) =
           *(undefined8 *)((long)in_RDI[0x2d] + (long)iVar6 * 8);
    }
    in_RDI[9].r = (half)(short)in_ESI;
    in_RDI[9].g = (half)(short)((uint)in_ESI >> 0x10);
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_198);
  poVar3 = std::operator<<(local_188,
                           "No frame buffer was specified as the pixel data destination for image file \""
                          );
  pcVar4 = InputPart::fileName((InputPart *)0x220cce);
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,local_198);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
RgbaInputFile::FromYca::readPixels (int scanLine)
{
    if (_fbBase == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "No frame buffer was specified as the "
            "pixel data destination for image file "
            "\"" << _inputPart.fileName ()
                 << "\".");
    }

    //
    // In order to convert one scan line to RGB format, we need that
    // scan line plus N2+1 extra scan lines above and N2+1 scan lines
    // below in luminance/chroma format.
    //
    // We allow random access to scan lines, but we buffer partially
    // processed luminance/chroma data in order to make reading pixels
    // in increasing y or decreasing y order reasonably efficient:
    //
    //	_currentScanLine	holds the y coordinate of the scan line
    //				that was most recently read.
    //
    //	_buf1			contains scan lines _currentScanLine-N2-1
    //				through _currentScanLine+N2+1 in
    //				luminance/chroma format.  Odd-numbered
    //				lines contain no chroma data.  Even-numbered
    //				lines have valid chroma data for all pixels.
    //
    //  _buf2			contains scan lines _currentScanLine-1
    //  			through _currentScanLine+1, in RGB format.
    //				Super-saturated pixels (see ImfRgbaYca.h)
    //				have not yet been eliminated.
    //
    // If the scan line we are trying to read now is close enough to
    // _currentScanLine, we don't have to recompute the contents of _buf1
    // and _buf2 from scratch.  We can rotate _buf1 and _buf2, and fill
    // in the missing data.
    //

    int dy = scanLine - _currentScanLine;

    if (abs (dy) < N + 2) rotateBuf1 (dy);

    if (abs (dy) < 3) rotateBuf2 (dy);

    if (dy < 0)
    {
        {
            int n    = min (-dy, N + 2);
            int yMin = scanLine - N2 - 1;

            for (int i = n - 1; i >= 0; --i)
                readYCAScanLine (yMin + i, _buf1[i]);
        }

        {
            int n = min (-dy, 3);

            for (int i = 0; i < n; ++i)
            {
                if ((scanLine + i) & 1)
                {
                    YCAtoRGBA (_yw, _width, _buf1[N2 + i], _buf2[i]);
                }
                else
                {
                    reconstructChromaVert (_width, _buf1 + i, _buf2[i]);
                    YCAtoRGBA (_yw, _width, _buf2[i], _buf2[i]);
                }
            }
        }
    }
    else
    {
        {
            int n    = min (dy, N + 2);
            int yMax = scanLine + N2 + 1;

            for (int i = n - 1; i >= 0; --i)
                readYCAScanLine (yMax - i, _buf1[N + 1 - i]);
        }

        {
            int n = min (dy, 3);

            for (int i = 2; i > 2 - n; --i)
            {
                if ((scanLine + i) & 1)
                {
                    YCAtoRGBA (_yw, _width, _buf1[N2 + i], _buf2[i]);
                }
                else
                {
                    reconstructChromaVert (_width, _buf1 + i, _buf2[i]);
                    YCAtoRGBA (_yw, _width, _buf2[i], _buf2[i]);
                }
            }
        }
    }

    fixSaturation (_yw, _width, _buf2, _tmpBuf);

    intptr_t base = reinterpret_cast<intptr_t> (_fbBase);
    for (int i = 0; i < _width; ++i)
    {
        Rgba* ptr = reinterpret_cast<Rgba*> (
            base +
            sizeof (Rgba) * (_fbYStride * scanLine + _fbXStride * (i + _xMin)));
        *ptr = _tmpBuf[i];
    }
    _currentScanLine = scanLine;
}